

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

string_view n_e_s::core::to_string(Family family)

{
  logic_error *this;
  string_view sVar1;
  
  if (family < (RRA|BRK)) {
    sVar1._M_str = &DAT_00122fb4 + *(int *)(&DAT_00122fb4 + (ulong)family * 4);
    sVar1._M_len = *(size_t *)(&DAT_001230b8 + (ulong)family * 8);
    return sVar1;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Unknown family");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string_view to_string(const Family family) {
    switch (family) {
    case Family::Invalid:
        return "Invalid";
    case Family::BRK:
        return "BRK";
    case Family::ASL:
        return "ASL";
    case Family::INC:
        return "INC";
    case Family::PHP:
        return "PHP";
    case Family::BPL:
        return "BPL";
    case Family::CLC:
        return "CLC";
    case Family::BIT:
        return "BIT";
    case Family::PLP:
        return "PLP";
    case Family::AND:
        return "AND";
    case Family::RTI:
        return "RTI";
    case Family::JSR:
        return "JSR";
    case Family::BMI:
        return "BMI";
    case Family::SEC:
        return "SEC";
    case Family::LSR:
        return "LSR";
    case Family::PHA:
        return "PHA";
    case Family::JMP:
        return "JMP";
    case Family::BVC:
        return "BVC";
    case Family::CLI:
        return "CLI";
    case Family::ADC:
        return "ADC";
    case Family::PLA:
        return "PLA";
    case Family::RTS:
        return "RTS";
    case Family::BVS:
        return "BVS";
    case Family::SEI:
        return "SEI";
    case Family::STY:
        return "STY";
    case Family::STA:
        return "STA";
    case Family::STX:
        return "STX";
    case Family::TXS:
        return "TXS";
    case Family::BCC:
        return "BCC";
    case Family::LDX:
        return "LDX";
    case Family::LDY:
        return "LDY";
    case Family::LDA:
        return "LDA";
    case Family::BCS:
        return "BCS";
    case Family::CLV:
        return "CLV";
    case Family::BNE:
        return "BNE";
    case Family::CLD:
        return "CLD";
    case Family::CPX:
        return "CPX";
    case Family::NOP:
        return "NOP";
    case Family::INX:
        return "INX";
    case Family::INY:
        return "INY";
    case Family::CPY:
        return "CPY";
    case Family::CMP:
        return "CMP";
    case Family::DEC:
        return "DEC";
    case Family::BEQ:
        return "BEQ";
    case Family::SED:
        return "SED";
    case Family::TYA:
        return "TYA";
    case Family::TAY:
        return "TAY";
    case Family::TAX:
        return "TAX";
    case Family::TSX:
        return "TSX";
    case Family::TXA:
        return "TXA";
    case Family::DEY:
        return "DEY";
    case Family::DEX:
        return "DEX";
    case Family::EOR:
        return "EOR";
    case Family::ROL:
        return "ROL";
    case Family::ROR:
        return "ROR";
    case Family::ORA:
        return "ORA";
    case Family::SBC:
        return "SBC";
    case Family::LAX:
        return "LAX";
    case Family::SAX:
        return "SAX";
    case Family::DCP:
        return "DCP";
    case Family::ISB:
        return "ISB";
    case Family::SLO:
        return "SLO";
    case Family::RLA:
        return "RLA";
    case Family::SRE:
        return "SRE";
    case Family::RRA:
        return "RRA";
    }

    // Should not happen
    throw std::logic_error("Unknown family"); // GCOVR_EXCL_LINE
}